

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  barrier *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1b0;
  Message local_1a8;
  duration<long,_std::ratio<1L,_1000000L>_> local_1a0;
  int local_194;
  duration<long,_std::ratio<1L,_1000L>_> local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  duration<long,_std::ratio<1L,_1000L>_> local_140;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_138;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  type local_f8;
  join_thread local_e8;
  join_thread thd;
  TypeParam mtx;
  barrier step;
  TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  this_00 = (barrier *)&mtx.super_mutex_base.mtx_.super___mutex_base._M_mutex.__data.__list.__next;
  yamc::test::barrier::barrier(this_00,2);
  yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&thd);
  local_f8.mtx = (TypeParam *)&thd;
  local_f8.step = this_00;
  yamc::test::join_thread::
  join_thread<TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>::TestBody()::_lambda()_1_>
            (&local_e8,&local_f8);
  yamc::test::barrier::await
            ((barrier *)&mtx.super_mutex_base.mtx_.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  yamc::test::
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  ::stopwatch((stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
               *)&gtest_ar_.message_);
  local_138.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_144 = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_140,&local_144);
  local_130 = std::chrono::operator+(&local_138,&local_140);
  bVar1 = yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
          try_lock_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&thd,&local_130);
  local_121 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_120,
               (AssertionResult *)
               "mtx.try_lock_until(std::chrono::system_clock::now() + std::chrono::milliseconds(300))"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_194 = 300;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_190,&local_194);
  local_1a0 = yamc::test::
              stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed((stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                         *)&gtest_ar_.message_);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_188,"std::chrono::milliseconds(300)","sw.elapsed()",&local_190,
             &local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  yamc::test::barrier::await
            ((barrier *)&mtx.super_mutex_base.mtx_.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  yamc::test::join_thread::~join_thread(&local_e8);
  yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&thd);
  yamc::test::barrier::~barrier
            ((barrier *)&mtx.super_mutex_base.mtx_.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntilTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<> sw;
    EXPECT_FALSE(mtx.try_lock_until(std::chrono::system_clock::now() + TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}